

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O0

void setarray(context *ctx,lua_State *L,int index,int key)

{
  table *ptVar1;
  table *tbl;
  node n;
  int key_local;
  int index_local;
  lua_State *L_local;
  context *ctx_local;
  
  n.keyhash = key;
  n._20_4_ = index;
  setvalue(ctx,L,index,(node *)&tbl);
  ptVar1 = ctx->tbl;
  ptVar1->arraytype[(int)(n.keyhash - 1)] = n.next._1_1_;
  ptVar1->array[(int)(n.keyhash - 1)].tbl = tbl;
  return;
}

Assistant:

static void
setarray(struct context *ctx, lua_State *L, int index, int key) {
	struct node n;
	setvalue(ctx, L, index, &n);
	struct table *tbl = ctx->tbl;
	--key;	// base 0
	tbl->arraytype[key] = n.valuetype;
	tbl->array[key] = n.v;
}